

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O0

bool MeCab::CharProperty::compile(char *cfile,char *ufile,char *ofile)

{
  istringstream *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  _Ios_Openmode _Var6;
  char *pcVar7;
  long *plVar8;
  size_t sVar9;
  size_type sVar10;
  ostream *poVar11;
  char **ppcVar12;
  pointer ppVar13;
  pointer pRVar14;
  reference pvVar15;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_CharInfo>_>::value,_pair<iterator,_bool>_>
  _Var16;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  char buf [32];
  const_iterator it_2;
  uint size_1;
  ofstream ofs;
  int i_1;
  CharInfo c_2;
  const_iterator it_1;
  CharInfo c_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> table;
  const_iterator it;
  string key_1;
  size_t n;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unk;
  istream *is2;
  ifstream ifs2;
  istringstream iss2;
  CharInfo c;
  string key;
  size_t i;
  Range r;
  size_t pos;
  string high;
  string low;
  size_t size;
  istream *is;
  istringstream iss;
  ifstream ifs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  category_ary;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  category;
  vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  range;
  size_t id;
  scoped_fixed_array<char_*,_512> col;
  scoped_fixed_array<char,_8192> line;
  value_type *in_stack_ffffffffffffec48;
  scoped_fixed_array<char_*,_512> *in_stack_ffffffffffffec50;
  scoped_fixed_array<char_*,_512> *this;
  __normal_iterator<MeCab::CharInfo_*,_std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>_>
  in_stack_ffffffffffffec58;
  __normal_iterator<MeCab::CharInfo_*,_std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>_>
  in_stack_ffffffffffffec60;
  value_type *in_stack_ffffffffffffec68;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffec70;
  size_t in_stack_ffffffffffffec78;
  char **in_stack_ffffffffffffec80;
  char **in_stack_ffffffffffffec88;
  char *in_stack_ffffffffffffec90;
  char *in_stack_ffffffffffffecf0;
  ostream *in_stack_ffffffffffffed90;
  ostream *in_stack_ffffffffffffed98;
  CharInfo local_e08 [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dd8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dd0;
  undefined4 local_dc8;
  byte local_dc2;
  die local_dc1;
  long local_dc0 [64];
  int local_bc0;
  CharInfo local_bbc;
  Range *local_bb8;
  Range *local_bb0;
  __normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
  local_ba8;
  CharInfo *local_ba0;
  CharInfo *local_b98;
  CharInfo local_b90;
  allocator local_b89;
  string local_b88 [64];
  scoped_fixed_array<char_*,_512> local_b48;
  byte local_b2a;
  die local_b29;
  _Self local_b28;
  _Self local_b20;
  iterator local_b18;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_b10;
  iterator local_b08;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  local_b00;
  _Base_ptr local_af8;
  undefined1 local_af0;
  byte local_ae2;
  die local_ae1;
  _Self local_ae0;
  _Self local_ad8;
  allocator local_ac9;
  string local_ac8 [38];
  byte local_aa2;
  die local_aa1;
  size_t local_aa0;
  istringstream *local_a68;
  long local_a60 [65];
  allocator local_851;
  string local_850 [32];
  istringstream local_830 [390];
  byte local_6aa;
  die local_6a9;
  _Self local_6a8;
  allocator local_699;
  string local_698 [32];
  _Self local_678;
  byte local_66a;
  die local_669;
  _Self local_668;
  allocator local_659;
  string local_658 [32];
  _Self local_638;
  byte local_62a;
  die local_629;
  _Base_ptr local_628;
  undefined1 local_620;
  CharInfo local_5f0;
  byte local_5ea;
  die local_5e9;
  _Self local_5e8;
  _Self local_5e0;
  allocator local_5d1;
  string local_5d0 [37];
  byte local_5ab;
  die local_5aa;
  allocator local_5a9;
  string local_5a8 [38];
  byte local_582;
  die local_581;
  _Self local_580;
  allocator local_571;
  string local_570 [32];
  _Self local_550;
  size_t local_548;
  byte local_53a;
  die local_539;
  int local_538;
  int local_534;
  string local_518 [32];
  string local_4f8 [32];
  long local_4d8;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [38];
  byte local_482;
  die local_481;
  size_t local_480;
  istringstream *local_478;
  allocator local_469;
  string local_468 [32];
  istringstream local_448 [384];
  long local_2c8 [77];
  long local_60;
  scoped_fixed_array<char_*,_512> local_48;
  scoped_fixed_array<char,_8192> local_30;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  scoped_fixed_array<char,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)in_stack_ffffffffffffec50);
  scoped_fixed_array<char_*,_512>::scoped_fixed_array(in_stack_ffffffffffffec50);
  local_60 = 0;
  std::
  vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  ::vector((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
            *)0x148e54);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         *)0x148e61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x148e6e);
  std::ifstream::ifstream(local_2c8,local_8,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"DEFAULT 1 0 0\nSPACE   0 1 0\n0x0020 SPACE\n",&local_469);
  std::__cxx11::istringstream::istringstream(local_448,local_468,_S_in);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  local_478 = (istringstream *)local_2c8;
  bVar2 = std::ios::operator!((ios *)((long)local_2c8 + *(long *)(local_2c8[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,local_8);
    poVar11 = std::operator<<(poVar11," is not found. minimum setting is used");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    local_478 = local_448;
  }
  while( true ) {
    piVar1 = local_478;
    pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
    scoped_fixed_array<char,_8192>::size(&local_30);
    plVar8 = (long *)std::istream::getline((char *)piVar1,(long)pcVar7);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar3) break;
    pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
    sVar9 = strlen(pcVar7);
    if ((sVar9 != 0) &&
       (pcVar7 = scoped_fixed_array<char,_8192>::operator[](&local_30,0), *pcVar7 != '#')) {
      scoped_fixed_array<char,_8192>::get(&local_30);
      scoped_fixed_array<char_*,_512>::get(&local_48);
      scoped_fixed_array<char_*,_512>::size(&local_48);
      local_480 = tokenize2<char**>(in_stack_ffffffffffffec90,(char *)in_stack_ffffffffffffec88,
                                    in_stack_ffffffffffffec80,in_stack_ffffffffffffec78);
      local_482 = 0;
      if (local_480 < 2) {
        die::die(&local_481);
        local_482 = 1;
        poVar11 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                 );
        poVar11 = std::operator<<(poVar11,"(");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x99);
        poVar11 = std::operator<<(poVar11,") [");
        poVar11 = std::operator<<(poVar11,"size >= 2");
        poVar11 = std::operator<<(poVar11,"] ");
        poVar11 = std::operator<<(poVar11,"format error: ");
        pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
        poVar11 = std::operator<<(poVar11,pcVar7);
        die::operator&(&local_481,poVar11);
      }
      if ((local_482 & 1) != 0) {
        die::~die((die *)0x14930d);
      }
      ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,0);
      iVar4 = strncmp(*ppcVar12,"0x",2);
      if (iVar4 == 0) {
        ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,0);
        pcVar7 = *ppcVar12;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a8,pcVar7,&local_4a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        std::__cxx11::string::string(local_4d0);
        local_4d8 = std::__cxx11::string::find((char *)local_4a8,0x1a2d1d);
        if (local_4d8 == -1) {
          std::__cxx11::string::operator=(local_4d0,local_4a8);
        }
        else {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_4f8,(ulong)local_4a8);
          std::__cxx11::string::operator=(local_4d0,local_4f8);
          std::__cxx11::string::~string(local_4f8);
          std::__cxx11::string::substr((ulong)local_518,(ulong)local_4a8);
          std::__cxx11::string::operator=(local_4a8,local_518);
          std::__cxx11::string::~string(local_518);
        }
        anon_unknown_3::Range::Range((Range *)0x14955d);
        std::__cxx11::string::c_str();
        local_538 = anon_unknown_3::atohex(in_stack_ffffffffffffecf0);
        std::__cxx11::string::c_str();
        local_534 = anon_unknown_3::atohex(in_stack_ffffffffffffecf0);
        local_53a = 0;
        if ((((local_538 < 0) || (0xfffe < local_538)) || (local_534 < 0)) ||
           ((0xfffe < local_534 || (local_534 < local_538)))) {
          die::die(&local_539);
          local_53a = 1;
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,"(");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xae);
          poVar11 = std::operator<<(poVar11,") [");
          poVar11 = std::operator<<(poVar11,
                                    "r.low >= 0 && r.low < 0xffff && r.high >= 0 && r.high < 0xffff && r.low <= r.high"
                                   );
          poVar11 = std::operator<<(poVar11,"] ");
          poVar11 = std::operator<<(poVar11,"range error: low=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_538);
          poVar11 = std::operator<<(poVar11," high=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_534);
          die::operator&(&local_539,poVar11);
        }
        if ((local_53a & 1) != 0) {
          die::~die((die *)0x149774);
        }
        local_548 = 1;
        while ((local_548 < local_480 &&
               (ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,local_548),
               **ppcVar12 != '#'))) {
          local_582 = 0;
          ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,local_548);
          pcVar7 = *ppcVar12;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_570,pcVar7,&local_571);
          local_550._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                       *)in_stack_ffffffffffffec48,(key_type *)0x14989b);
          local_580._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                      *)in_stack_ffffffffffffec48);
          bVar3 = std::operator!=(&local_550,&local_580);
          if (!bVar3) {
            die::die(&local_581);
            local_582 = 1;
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                     );
            poVar11 = std::operator<<(poVar11,"(");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xb5);
            poVar11 = std::operator<<(poVar11,") [");
            poVar11 = std::operator<<(poVar11,"category.find(std::string(col[i])) != category.end()"
                                     );
            poVar11 = std::operator<<(poVar11,"] ");
            poVar11 = std::operator<<(poVar11,"category [");
            ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,local_548);
            poVar11 = std::operator<<(poVar11,*ppcVar12);
            poVar11 = std::operator<<(poVar11,"] is undefined");
            die::operator&(&local_581,poVar11);
          }
          if ((local_582 & 1) != 0) {
            die::~die((die *)0x149a61);
          }
          std::__cxx11::string::~string(local_570);
          std::allocator<char>::~allocator((allocator<char> *)&local_571);
          ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,local_548);
          pcVar7 = *ppcVar12;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5a8,pcVar7,&local_5a9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
          std::__cxx11::string::~string(local_5a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
          local_548 = local_548 + 1;
        }
        std::
        vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
        ::push_back((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                     *)in_stack_ffffffffffffec60._M_current,
                    (value_type *)in_stack_ffffffffffffec58._M_current);
        anon_unknown_3::Range::~Range((Range *)0x149c1f);
        std::__cxx11::string::~string(local_4d0);
        std::__cxx11::string::~string(local_4a8);
      }
      else {
        local_5ab = 0;
        if (local_480 < 4) {
          die::die(&local_5aa);
          local_5ab = 1;
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,"(");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xbb);
          poVar11 = std::operator<<(poVar11,") [");
          poVar11 = std::operator<<(poVar11,"size >= 4");
          poVar11 = std::operator<<(poVar11,"] ");
          poVar11 = std::operator<<(poVar11,"format error: ");
          pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
          poVar11 = std::operator<<(poVar11,pcVar7);
          die::operator&(&local_5aa,poVar11);
        }
        if ((local_5ab & 1) != 0) {
          die::~die((die *)0x149dd3);
        }
        ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,0);
        pcVar7 = *ppcVar12;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5d0,pcVar7,&local_5d1);
        std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
        local_5ea = 0;
        local_5e0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                     *)in_stack_ffffffffffffec48,(key_type *)0x149e5f);
        local_5e8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                    *)in_stack_ffffffffffffec48);
        bVar3 = std::operator==(&local_5e0,&local_5e8);
        if (!bVar3) {
          die::die(&local_5e9);
          local_5ea = 1;
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,"(");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xbe);
          poVar11 = std::operator<<(poVar11,") [");
          poVar11 = std::operator<<(poVar11,"category.find(key) == category.end()");
          poVar11 = std::operator<<(poVar11,"] ");
          poVar11 = std::operator<<(poVar11,"category ");
          poVar11 = std::operator<<(poVar11,local_5d0);
          poVar11 = std::operator<<(poVar11," is already defined");
          die::operator&(&local_5e9,poVar11);
        }
        if ((local_5ea & 1) != 0) {
          die::~die((die *)0x14a003);
        }
        CharInfo::CharInfo(&local_5f0);
        local_5f0 = (CharInfo)0x0;
        ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,1);
        iVar4 = atoi(*ppcVar12);
        local_5f0 = (CharInfo)((uint)local_5f0 & 0x7fffffff | iVar4 << 0x1f);
        ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,2);
        uVar5 = atoi(*ppcVar12);
        local_5f0 = (CharInfo)((uint)local_5f0 & 0xbfffffff | (uVar5 & 1) << 0x1e);
        ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,3);
        uVar5 = atoi(*ppcVar12);
        local_5f0 = (CharInfo)
                    ((uint)local_5f0 & 0xc003ffff | (uVar5 & 0xf) << 0x1a |
                    ((uint)local_60 & 0xff) << 0x12);
        local_60 = local_60 + 1;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MeCab::CharInfo_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
                    *)in_stack_ffffffffffffec60._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffec58._M_current,(CharInfo *)in_stack_ffffffffffffec50);
        _Var16 = std::
                 map<std::__cxx11::string,MeCab::CharInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>>
                 ::insert<std::pair<std::__cxx11::string,MeCab::CharInfo>>
                           ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                             *)in_stack_ffffffffffffec60._M_current,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
                             *)in_stack_ffffffffffffec58._M_current);
        local_628 = (_Base_ptr)_Var16.first._M_node;
        local_620 = _Var16.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
                 *)0x14a198);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffec60._M_current,
                    (value_type *)in_stack_ffffffffffffec58._M_current);
        std::__cxx11::string::~string(local_5d0);
      }
    }
  }
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                   *)0x14a2a3);
  local_62a = 0;
  if (0x11 < sVar10) {
    die::die(&local_629);
    local_62a = 1;
    poVar11 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                             );
    poVar11 = std::operator<<(poVar11,"(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xcd);
    poVar11 = std::operator<<(poVar11,") [");
    poVar11 = std::operator<<(poVar11,"category.size() < 18");
    poVar11 = std::operator<<(poVar11,"] ");
    poVar11 = std::operator<<(poVar11,"too many categories(>= 18)");
    die::operator&(&local_629,poVar11);
  }
  if ((local_62a & 1) != 0) {
    die::~die((die *)0x14a3ce);
  }
  std::allocator<char>::allocator();
  local_66a = 0;
  std::__cxx11::string::string(local_658,"DEFAULT",&local_659);
  local_638._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
               *)in_stack_ffffffffffffec48,(key_type *)0x14a41e);
  local_668._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              *)in_stack_ffffffffffffec48);
  bVar3 = std::operator!=(&local_638,&local_668);
  if (!bVar3) {
    die::die(&local_669);
    local_66a = 1;
    poVar11 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                             );
    poVar11 = std::operator<<(poVar11,"(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xcf);
    poVar11 = std::operator<<(poVar11,") [");
    poVar11 = std::operator<<(poVar11,"category.find(\"DEFAULT\") != category.end()");
    poVar11 = std::operator<<(poVar11,"] ");
    poVar11 = std::operator<<(poVar11,"category [DEFAULT] is undefined");
    die::operator&(&local_669,poVar11);
  }
  if ((local_66a & 1) != 0) {
    die::~die((die *)0x14a585);
  }
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  local_6aa = 0;
  std::__cxx11::string::string(local_698,"SPACE",&local_699);
  local_678._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
               *)in_stack_ffffffffffffec48,(key_type *)0x14a5ef);
  local_6a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
              *)in_stack_ffffffffffffec48);
  bVar3 = std::operator!=(&local_678,&local_6a8);
  if (!bVar3) {
    die::die(&local_6a9);
    local_6aa = 1;
    poVar11 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                             );
    poVar11 = std::operator<<(poVar11,"(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xd2);
    poVar11 = std::operator<<(poVar11,") [");
    poVar11 = std::operator<<(poVar11,"category.find(\"SPACE\") != category.end()");
    poVar11 = std::operator<<(poVar11,"] ");
    poVar11 = std::operator<<(poVar11,"category [SPACE] is undefined");
    die::operator&(&local_6a9,poVar11);
  }
  if ((local_6aa & 1) != 0) {
    die::~die((die *)0x14a756);
  }
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n",&local_851);
  std::__cxx11::istringstream::istringstream(local_830,local_850,_S_in);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::ifstream::ifstream(local_a60,local_10,_S_in);
  local_a68 = (istringstream *)local_a60;
  bVar2 = std::ios::operator!((ios *)((long)local_a60 + *(long *)(local_a60[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,local_10);
    poVar11 = std::operator<<(poVar11," is not found. minimum setting is used.");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    local_a68 = local_830;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x14aa4c);
  while( true ) {
    piVar1 = local_a68;
    pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
    scoped_fixed_array<char,_8192>::size(&local_30);
    plVar8 = (long *)std::istream::getline((char *)piVar1,(long)pcVar7);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if (!bVar3) break;
    scoped_fixed_array<char,_8192>::get(&local_30);
    scoped_fixed_array<char_*,_512>::get(&local_48);
    local_aa0 = tokenizeCSV<char**>(in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,
                                    (size_t)in_stack_ffffffffffffec80);
    local_aa2 = 0;
    if (local_aa0 == 0) {
      die::die(&local_aa1);
      local_aa2 = 1;
      poVar11 = std::operator<<((ostream *)&std::cerr,
                                "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                               );
      poVar11 = std::operator<<(poVar11,"(");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xe2);
      poVar11 = std::operator<<(poVar11,") [");
      poVar11 = std::operator<<(poVar11,"n >= 1");
      poVar11 = std::operator<<(poVar11,"] ");
      poVar11 = std::operator<<(poVar11,"format error: ");
      pcVar7 = scoped_fixed_array<char,_8192>::get(&local_30);
      poVar11 = std::operator<<(poVar11,pcVar7);
      die::operator&(&local_aa1,poVar11);
    }
    if ((local_aa2 & 1) != 0) {
      die::~die((die *)0x14acac);
    }
    ppcVar12 = scoped_fixed_array<char_*,_512>::operator[](&local_48,0);
    pcVar7 = *ppcVar12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ac8,pcVar7,&local_ac9);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    local_ae2 = 0;
    local_ad8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                 *)in_stack_ffffffffffffec48,(key_type *)0x14ad38);
    local_ae0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                *)in_stack_ffffffffffffec48);
    bVar3 = std::operator!=(&local_ad8,&local_ae0);
    if (!bVar3) {
      die::die(&local_ae1);
      local_ae2 = 1;
      in_stack_ffffffffffffed98 =
           std::operator<<((ostream *)&std::cerr,
                           "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                          );
      in_stack_ffffffffffffed90 = std::operator<<(in_stack_ffffffffffffed98,"(");
      poVar11 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffed90,0xe4);
      poVar11 = std::operator<<(poVar11,") [");
      poVar11 = std::operator<<(poVar11,"category.find(key) != category.end()");
      poVar11 = std::operator<<(poVar11,"] ");
      poVar11 = std::operator<<(poVar11,"category [");
      poVar11 = std::operator<<(poVar11,local_ac8);
      poVar11 = std::operator<<(poVar11,"] is undefined in ");
      poVar11 = std::operator<<(poVar11,local_8);
      die::operator&(&local_ae1,poVar11);
    }
    if ((local_ae2 & 1) != 0) {
      die::~die((die *)0x14aefb);
    }
    pVar17 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(in_stack_ffffffffffffec70,in_stack_ffffffffffffec68);
    local_af8 = (_Base_ptr)pVar17.first._M_node;
    local_af0 = pVar17.second;
    std::__cxx11::string::~string(local_ac8);
  }
  local_b08._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                *)in_stack_ffffffffffffec48);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
  ::_Rb_tree_const_iterator(&local_b00,&local_b08);
  while( true ) {
    local_b18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                *)in_stack_ffffffffffffec48);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
    ::_Rb_tree_const_iterator(&local_b10,&local_b18);
    bVar3 = std::operator!=(&local_b00,&local_b10);
    if (!bVar3) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                  *)0x14b098);
    local_b2a = 0;
    local_b20._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffec58._M_current,(key_type *)in_stack_ffffffffffffec50);
    local_b28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffec48);
    bVar3 = std::operator!=(&local_b20,&local_b28);
    if (!bVar3) {
      die::die(&local_b29);
      local_b2a = 1;
      poVar11 = std::operator<<((ostream *)&std::cerr,
                                "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                               );
      poVar11 = std::operator<<(poVar11,"(");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0xec);
      poVar11 = std::operator<<(poVar11,") [");
      poVar11 = std::operator<<(poVar11,"unk.find(it->first) != unk.end()");
      poVar11 = std::operator<<(poVar11,"] ");
      poVar11 = std::operator<<(poVar11,"category [");
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                              *)0x14b1f2);
      poVar11 = std::operator<<(poVar11,(string *)ppVar13);
      poVar11 = std::operator<<(poVar11,"] is undefined in ");
      poVar11 = std::operator<<(poVar11,local_10);
      die::operator&(&local_b29,poVar11);
    }
    if ((local_b2a & 1) != 0) {
      die::~die((die *)0x14b27b);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>
                  *)in_stack_ffffffffffffec50);
  }
  std::allocator<MeCab::CharInfo>::allocator((allocator<MeCab::CharInfo> *)0x14b2d6);
  std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::vector
            ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)in_stack_ffffffffffffec70,
             (size_type)in_stack_ffffffffffffec68,
             (allocator_type *)in_stack_ffffffffffffec60._M_current);
  std::allocator<MeCab::CharInfo>::~allocator((allocator<MeCab::CharInfo> *)0x14b2ff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14b30c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"DEFAULT",&local_b89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  local_b90 = anon_unknown_3::encode
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffed98,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                          *)in_stack_ffffffffffffed90);
  local_b98 = (CharInfo *)
              std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::begin
                        ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)
                         in_stack_ffffffffffffec48);
  local_ba0 = (CharInfo *)
              std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::end
                        ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)
                         in_stack_ffffffffffffec48);
  std::
  fill<__gnu_cxx::__normal_iterator<MeCab::CharInfo*,std::vector<MeCab::CharInfo,std::allocator<MeCab::CharInfo>>>,MeCab::CharInfo>
            (in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,
             (CharInfo *)in_stack_ffffffffffffec50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffec60._M_current);
  local_bb0 = (Range *)std::
                       vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                       ::begin((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                                *)in_stack_ffffffffffffec48);
  __gnu_cxx::
  __normal_iterator<MeCab::(anonymous_namespace)::Range_const*,std::vector<MeCab::(anonymous_namespace)::Range,std::allocator<MeCab::(anonymous_namespace)::Range>>>
  ::__normal_iterator<MeCab::(anonymous_namespace)::Range*>
            ((__normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
              *)in_stack_ffffffffffffec50,
             (__normal_iterator<MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
              *)in_stack_ffffffffffffec48);
  while( true ) {
    local_bb8 = (Range *)std::
                         vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                         ::end((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                                *)in_stack_ffffffffffffec48);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
                        *)in_stack_ffffffffffffec50,
                       (__normal_iterator<MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
                        *)in_stack_ffffffffffffec48);
    pcVar7 = local_18;
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
    ::operator->(&local_ba8);
    local_bbc = anon_unknown_3::encode
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffed98,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                            *)in_stack_ffffffffffffed90);
    pRVar14 = __gnu_cxx::
              __normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
              ::operator->(&local_ba8);
    for (local_bc0 = pRVar14->low; iVar4 = local_bc0,
        pRVar14 = __gnu_cxx::
                  __normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_ba8), iVar4 <= pRVar14->high; local_bc0 = local_bc0 + 1) {
      pvVar15 = std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::operator[]
                          ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)&local_b48,
                           (long)local_bc0);
      *pvVar15 = local_bbc;
    }
    __gnu_cxx::
    __normal_iterator<const_MeCab::(anonymous_namespace)::Range_*,_std::vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>_>
    ::operator++(&local_ba8);
  }
  _Var6 = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream(local_dc0,pcVar7,_Var6);
  local_dc2 = 0;
  bVar3 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_dc0 + *(long *)(local_dc0[0] + -0x18)));
  if (!bVar3) {
    die::die(&local_dc1);
    local_dc2 = 1;
    poVar11 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                             );
    poVar11 = std::operator<<(poVar11,"(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x104);
    poVar11 = std::operator<<(poVar11,") [");
    poVar11 = std::operator<<(poVar11,"ofs");
    poVar11 = std::operator<<(poVar11,"] ");
    poVar11 = std::operator<<(poVar11,"permission denied: ");
    poVar11 = std::operator<<(poVar11,local_18);
    die::operator&(&local_dc1,poVar11);
  }
  if ((local_dc2 & 1) != 0) {
    die::~die((die *)0x14b72e);
  }
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                   *)0x14b73b);
  local_dc8 = (undefined4)sVar10;
  std::ostream::write((char *)local_dc0,(long)&local_dc8);
  local_dd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec48);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffec50,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffec48);
  while( true ) {
    local_de0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffec48);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffec50,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffec48);
    if (!bVar3) break;
    std::fill<char*,char>
              ((char *)in_stack_ffffffffffffec50,(char *)in_stack_ffffffffffffec48,(char *)0x14b7e0)
    ;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_dd0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    in_stack_ffffffffffffec60._M_current = local_e08;
    strncpy((char *)in_stack_ffffffffffffec60._M_current,pcVar7,0x1f);
    std::ostream::write((char *)local_dc0,(long)in_stack_ffffffffffffec60._M_current);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_dd0);
  }
  this = &local_b48;
  pvVar15 = std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::operator[]
                      ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)this,0);
  std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::size
            ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)this);
  std::ostream::write((char *)local_dc0,(long)pvVar15);
  std::ofstream::close();
  std::ofstream::~ofstream(local_dc0);
  std::vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_>::~vector
            ((vector<MeCab::CharInfo,_std::allocator<MeCab::CharInfo>_> *)
             in_stack_ffffffffffffec60._M_current);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x14b8ff);
  std::ifstream::~ifstream(local_a60);
  std::__cxx11::istringstream::~istringstream(local_830);
  std::__cxx11::istringstream::~istringstream(local_448);
  std::ifstream::~ifstream(local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffec60._M_current);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
          *)0x14b94d);
  std::
  vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  ::~vector((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
             *)in_stack_ffffffffffffec60._M_current);
  scoped_fixed_array<char_*,_512>::~scoped_fixed_array(this);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array((scoped_fixed_array<char,_8192> *)this);
  return true;
}

Assistant:

bool CharProperty::compile(const char *cfile,
                           const char *ufile,
                           const char *ofile) {
  scoped_fixed_array<char, BUF_SIZE> line;
  scoped_fixed_array<char *, 512> col;
  size_t id = 0;
  std::vector<Range> range;
  std::map<std::string, CharInfo> category;
  std::vector<std::string> category_ary;
  std::ifstream ifs(WPATH(cfile));
  std::istringstream iss(CHAR_PROPERTY_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << cfile
              << " is not found. minimum setting is used" << std::endl;
    is = &iss;
  }

  while (is->getline(line.get(), line.size())) {
    if (std::strlen(line.get()) == 0 || line[0] == '#') {
      continue;
    }
    const size_t size = tokenize2(line.get(), "\t ", col.get(), col.size());
    CHECK_DIE(size >= 2) << "format error: " << line.get();

    // 0xFFFF..0xFFFF hoge hoge hgoe #
    if (std::strncmp(col[0], "0x", 2) == 0) {
      std::string low = col[0];
      std::string high;
      size_t pos = low.find("..");

      if (pos != std::string::npos) {
        high = low.substr(pos + 2, low.size() - pos - 2);
        low  = low.substr(0, pos);
      } else {
        high = low;
      }

      Range r;
      r.low = atohex(low.c_str());
      r.high = atohex(high.c_str());

      CHECK_DIE(r.low >= 0 && r.low < 0xffff &&
                r.high >= 0 && r.high < 0xffff &&
                r.low <= r.high)
          << "range error: low=" << r.low << " high=" << r.high;

      for (size_t i = 1; i < size; ++i) {
        if (col[i][0] == '#') {
          break;  // skip comments
        }
        CHECK_DIE(category.find(std::string(col[i])) != category.end())
            << "category [" << col[i] << "] is undefined";
        r.c.push_back(col[i]);
      }
      range.push_back(r);
    } else {
      CHECK_DIE(size >= 4) << "format error: " << line.get();

      std::string key = col[0];
      CHECK_DIE(category.find(key) == category.end())
          << "category " << key << " is already defined";

      CharInfo c;
      std::memset(&c, 0, sizeof(c));
      c.invoke  = std::atoi(col[1]);
      c.group   = std::atoi(col[2]);
      c.length  = std::atoi(col[3]);
      c.default_type = id++;

      category.insert(std::pair<std::string, CharInfo>(key, c));
      category_ary.push_back(key);
    }
  }

  CHECK_DIE(category.size() < 18) << "too many categories(>= 18)";

  CHECK_DIE(category.find("DEFAULT") != category.end())
      << "category [DEFAULT] is undefined";

  CHECK_DIE(category.find("SPACE") != category.end())
      << "category [SPACE] is undefined";

  std::istringstream iss2(UNK_DEF_DEFAULT);
  std::ifstream ifs2(WPATH(ufile));
  std::istream *is2 = &ifs2;

  if (!ifs2) {
    std::cerr << ufile
              << " is not found. minimum setting is used." << std::endl;
    is2 = &iss2;
  }

  std::set<std::string> unk;
  while (is2->getline(line.get(), line.size())) {
    const size_t n = tokenizeCSV(line.get(), col.get(), 2);
    CHECK_DIE(n >= 1) << "format error: " << line.get();
    const std::string key = col[0];
    CHECK_DIE(category.find(key) != category.end())
        << "category [" << key << "] is undefined in " << cfile;
    unk.insert(key);
  }

  for (std::map<std::string, CharInfo>::const_iterator it = category.begin();
       it != category.end();
       ++it) {
    CHECK_DIE(unk.find(it->first) != unk.end())
        << "category [" << it->first << "] is undefined in " << ufile;
  }

  std::vector<CharInfo> table(0xffff);
  {
    std::vector<std::string> tmp;
    tmp.push_back("DEFAULT");
    const CharInfo c = encode(tmp, &category);
    std::fill(table.begin(), table.end(), c);
  }

  for (std::vector<Range>::const_iterator it = range.begin();
       it != range.end();
       ++it) {
    const CharInfo c = encode(it->c, &category);
    for (int i = it->low; i <= it->high; ++i) {
      table[i] = c;
    }
  }

  // output binary table
  {
    std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
    CHECK_DIE(ofs) << "permission denied: " << ofile;

    unsigned int size = static_cast<unsigned int>(category.size());
    ofs.write(reinterpret_cast<const char*>(&size), sizeof(size));
    for (std::vector<std::string>::const_iterator it = category_ary.begin();
         it != category_ary.end();
         ++it) {
      char buf[32];
      std::fill(buf, buf + sizeof(buf), '\0');
      std::strncpy(buf, it->c_str(), sizeof(buf) - 1);
      ofs.write(reinterpret_cast<const char*>(buf), sizeof(buf));
    }
    ofs.write(reinterpret_cast<const char*>(&table[0]),
              sizeof(CharInfo) * table.size());
    ofs.close();
  }

  return true;
}